

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cpp
# Opt level: O0

QString * formatFunctionSignature(QList<Tracepoint::Argument> *args)

{
  undefined8 in_RSI;
  QString *in_RDI;
  
  joinArguments<formatFunctionSignature(QList<Tracepoint::Argument>const&)::__0>(in_RDI,in_RSI);
  return in_RDI;
}

Assistant:

QString formatFunctionSignature(const QList<Tracepoint::Argument> &args)
{
    return joinArguments(args, [](const Tracepoint::Argument &arg) {
            return QStringLiteral("%1 %2").arg(arg.type).arg(arg.name);
    });
}